

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void * rw::ps2::copyADC(void *dst,void *src,int32 offset,int32 param_4)

{
  int iVar1;
  void *__dest;
  long lVar2;
  ulong __n;
  
  lVar2 = (long)offset;
  iVar1 = *(int *)((long)src + lVar2);
  *(int *)((long)dst + lVar2) = iVar1;
  if (iVar1 != 0) {
    iVar1 = *(int *)((long)src + lVar2 + 0x10);
    *(int *)((long)dst + lVar2 + 0x10) = iVar1;
    __n = (long)iVar1 + 3U & 0xfffffffffffffffc;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1246"
    ;
    __dest = (void *)(*DAT_00145dd8)(__n,0x30134);
    *(void **)((long)dst + lVar2 + 8) = __dest;
    memcpy(__dest,*(void **)((long)src + lVar2 + 8),__n);
  }
  return dst;
}

Assistant:

static void*
copyADC(void *dst, void *src, int32 offset, int32)
{
	ADCData *dstadc = PLUGINOFFSET(ADCData, dst, offset);
	ADCData *srcadc = PLUGINOFFSET(ADCData, src, offset);
	dstadc->adcFormatted = srcadc->adcFormatted;
	if(!dstadc->adcFormatted)
		return dst;
	dstadc->numBits = srcadc->numBits;
	int32 size = dstadc->numBits+3 & ~3;
	dstadc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	memcpy(dstadc->adcBits, srcadc->adcBits, size);
	return dst;
}